

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t dma_read(nettlp *nt,uintptr_t addr,void *buf,size_t count)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  size_t in_RCX;
  ulong in_RSI;
  long in_RDI;
  uint32_t dst_addr32;
  uint64_t dst_addr64;
  tlp_mr_hdr mh;
  nettlp_hdr nh;
  iovec iov [3];
  int ret;
  __uint32_t local_84;
  __uint64_t local_80;
  byte local_76 [2];
  uint16_t local_74;
  uint16_t local_72;
  undefined1 local_70;
  byte local_6f;
  undefined1 local_6e [6];
  iovec local_68;
  byte *local_58;
  undefined8 local_50;
  __uint64_t *local_48;
  undefined8 local_40;
  int local_2c;
  size_t local_28;
  ulong local_18;
  long local_10;
  long local_8;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_6e,0,6);
  memset(local_76,0,8);
  local_68.iov_base = local_6e;
  local_68.iov_len = 6;
  local_58 = local_76;
  local_50 = 8;
  if (local_18 < 0xffffffff) {
    local_76[0] = local_76[0] & 0x80;
    local_84 = __bswap_32((uint)local_18 & 0xfffffffc);
    local_48 = (__uint64_t *)&local_84;
    local_40 = 4;
  }
  else {
    local_76[0] = local_76[0] & 0x80 | 0x20;
    local_80 = __bswap_64(local_18 & 0xfffffffffffffffc);
    local_48 = &local_80;
    local_40 = 8;
  }
  local_72 = ntohs(*(uint16_t *)(local_10 + 8));
  local_70 = *(undefined1 *)(local_10 + 10);
  iVar2 = tlp_calculate_lstdw(local_18,local_28);
  local_6f = local_6f & 0xf | (char)iVar2 << 4;
  iVar2 = tlp_calculate_fstdw(local_18,local_28);
  local_6f = local_6f & 0xf0 | (byte)iVar2 & 0xf;
  uVar1 = ntohs(local_74);
  iVar2 = tlp_calculate_length(local_18,local_28);
  local_74 = htons(uVar1 & 0xfc00 | (ushort)iVar2);
  sVar3 = writev(*(int *)(local_10 + 0x10),&local_68,3);
  local_2c = (int)sVar3;
  if (local_2c < 0) {
    local_8 = (long)local_2c;
  }
  else {
    local_8 = libtlp_read_cpld((nettlp *)iov[1].iov_len,iov[1].iov_base,iov[0].iov_len);
  }
  return local_8;
}

Assistant:

ssize_t dma_read(struct nettlp *nt, uintptr_t addr, void *buf, size_t count)
{
	int ret;
	struct iovec iov[3];
	struct nettlp_hdr nh;
	struct tlp_mr_hdr mh;
	uint64_t dst_addr64;
	uint32_t dst_addr32;

	memset(&nh, 0, sizeof(nh));
	memset(&mh, 0, sizeof(mh));

	iov[0].iov_base = &nh;
	iov[0].iov_len = sizeof(nh);
	iov[1].iov_base = &mh;
	iov[1].iov_len = sizeof(mh);

	/* build memory read request  */
	tlp_set_type(mh.tlp.fmt_type, TLP_TYPE_MRd);
	if (addr < UINT32_MAX) {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_3DW, TLP_FMT_WO_DATA);
		dst_addr32 = htobe32(addr & 0xFFFFFFFC);
		iov[2].iov_base = &dst_addr32;
		iov[2].iov_len = sizeof(dst_addr32);
	} else {
		tlp_set_fmt(mh.tlp.fmt_type, TLP_FMT_4DW, TLP_FMT_WO_DATA);
		dst_addr64 = htobe64(addr & 0xFFFFFFFFFFFFFFFC);
		iov[2].iov_base = &dst_addr64;
		iov[2].iov_len = sizeof(dst_addr64);
	}
	mh.requester = ntohs(nt->requester);
	mh.tag = nt->tag;
	mh.lstdw = tlp_calculate_lstdw(addr, count);
	mh.fstdw = tlp_calculate_fstdw(addr, count);
	tlp_set_length(mh.tlp.falen, tlp_calculate_length(addr, count));
	

	ret = writev(nt->sockfd, iov, 3);
	if (ret < 0)
		return ret;

	return libtlp_read_cpld(nt, buf, count);
}